

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_types.cpp
# Opt level: O1

shared_ptr<duckdb::ExtraTypeInfo,_true> __thiscall
duckdb::ListTypeInfo::Deserialize(ListTypeInfo *this,Deserializer *deserializer)

{
  ListTypeInfo *pLVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::ExtraTypeInfo,_true> sVar2;
  shared_ptr<duckdb::ListTypeInfo,_true> result;
  shared_ptr<duckdb::ListTypeInfo,_true> local_28;
  
  pLVar1 = (ListTypeInfo *)operator_new(0x50);
  ListTypeInfo(pLVar1);
  local_28.internal.super___shared_ptr<duckdb::ListTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       pLVar1;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<duckdb::ListTypeInfo*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_28.internal.super___shared_ptr<duckdb::ListTypeInfo,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,pLVar1);
  pLVar1 = shared_ptr<duckdb::ListTypeInfo,_true>::operator->(&local_28);
  Deserializer::ReadProperty<duckdb::LogicalType>(deserializer,200,"child_type",&pLVar1->child_type)
  ;
  *(undefined8 *)&(this->super_ExtraTypeInfo).type = 0;
  (this->super_ExtraTypeInfo)._vptr_ExtraTypeInfo =
       (_func_int **)
       local_28.internal.super___shared_ptr<duckdb::ListTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(this->super_ExtraTypeInfo).type =
       local_28.internal.super___shared_ptr<duckdb::ListTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  sVar2.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar2.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_ExtraTypeInfo;
  return (shared_ptr<duckdb::ExtraTypeInfo,_true>)
         sVar2.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<ExtraTypeInfo> ListTypeInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::shared_ptr<ListTypeInfo>(new ListTypeInfo());
	deserializer.ReadProperty<LogicalType>(200, "child_type", result->child_type);
	return std::move(result);
}